

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

bool beast::extract_identifiers(identifier_list *identifiers,bool allowLeadingZeroes,string *input)

{
  bool bVar1;
  ulong uVar2;
  allocator local_79;
  string local_78;
  uint local_58;
  undefined1 local_48 [8];
  string s;
  string *input_local;
  bool allowLeadingZeroes_local;
  identifier_list *identifiers_local;
  
  s.field_2._8_8_ = input;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    do {
      std::__cxx11::string::string((string *)local_48);
      bVar1 = extract_identifier((string *)local_48,allowLeadingZeroes,(string *)s.field_2._8_8_);
      if (bVar1) {
        unit_test::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)identifiers,(value_type *)local_48);
      }
      else {
        identifiers_local._7_1_ = 0;
      }
      local_58 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_48);
      if (local_58 != 0) goto LAB_0030a53c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,".",&local_79);
      bVar1 = chop(&local_78,(string *)s.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    } while (bVar1);
    identifiers_local._7_1_ = 1;
  }
  else {
    identifiers_local._7_1_ = 0;
  }
LAB_0030a53c:
  return (bool)(identifiers_local._7_1_ & 1);
}

Assistant:

bool extract_identifiers (
    SemanticVersion::identifier_list& identifiers,
    bool allowLeadingZeroes,
    std::string& input)
{
    if (input.empty ())
        return false;

    do {
        std::string s;

        if (!extract_identifier (s, allowLeadingZeroes, input))
            return false;
        identifiers.push_back (s);
    } while (chop (".", input));

    return true;
}